

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_test.c
# Opt level: O1

void test_case_unsigned_div(zt_unit_test *test,void *data)

{
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  return;
}

Assistant:

static void
test_case_unsigned_div(struct zt_unit_test *test, void *data UNUSED)
{
    /* unsigned division */
    /* char */
    ZT_UNIT_ASSERT(test, zt_uchar_div(1, CHAR_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_uchar_div(CHAR_MAX, 1) == CHAR_MAX);

    ZT_UNIT_ASSERT(test, zt_uchar_div(0, CHAR_MAX) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_uchar_div(CHAR_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_uchar_div(CHAR_MAX, 2) == CHAR_MAX / 2);

    /* char */
    ZT_UNIT_ASSERT(test, zt_ushort_div(1, CHAR_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_ushort_div(CHAR_MAX, 1) == CHAR_MAX);

    ZT_UNIT_ASSERT(test, zt_ushort_div(0, CHAR_MAX) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_ushort_div(CHAR_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_ushort_div(CHAR_MAX, 2) == CHAR_MAX / 2);

    /* int */
    ZT_UNIT_ASSERT(test, zt_uint_div(1, INT_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_uint_div(INT_MAX, 1) == INT_MAX);

    ZT_UNIT_ASSERT(test, zt_uint_div(0, INT_MAX) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_uint_div(INT_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_uint_div(INT_MAX, 2) == INT_MAX / 2);

# ifndef __x86_64__
    /* long */
    ZT_UNIT_ASSERT(test, zt_ulong_div(1, LONG_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_ulong_div(LONG_MAX, 1) == LONG_MAX);

    ZT_UNIT_ASSERT(test, zt_ulong_div(0, LONG_MAX) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_ulong_div(LONG_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_ulong_div(LONG_MAX, 2) == LONG_MAX / 2);
# endif /* ifndef __x86_64__ */
}